

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

Glyph * __thiscall
sf::Font::getGlyph(Font *this,Uint32 codePoint,uint characterSize,bool bold,float outlineThickness)

{
  bool bVar1;
  Page *__x;
  Uint64 UVar2;
  pointer ppVar3;
  undefined1 in_CL;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long_long,_Glyph>_>::value,_pair<iterator,_bool>_>
  _Var4;
  uint in_stack_0000005c;
  Font *in_stack_00000060;
  Glyph glyph;
  const_iterator it;
  Uint64 key;
  GlyphTable *glyphs;
  undefined4 in_stack_fffffffffffffef8;
  Uint32 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  unsigned_long_long *__x_00;
  map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
  *this_00;
  map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
  local_c8;
  _Base_ptr local_90;
  undefined1 local_88;
  unsigned_long_long local_7c [5];
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> local_38;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar5;
  Glyph *local_8;
  
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  __x = loadPage(in_stack_00000060,in_stack_0000005c);
  FT_Get_Char_Index(*(undefined8 *)(in_RDI + 8),in_ESI);
  UVar2 = anon_unknown.dwarf_222ca4::combine
                    ((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffff00 >> 0x18,0),in_stack_fffffffffffffefc);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
       ::find((map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
               *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
              (key_type_conflict2 *)0x2b4c69);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::
  _Rb_tree_const_iterator(&local_38,&local_40);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
       ::end((map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
              *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::
  _Rb_tree_const_iterator(&local_48,&local_50);
  bVar1 = std::operator!=(&local_38,&local_48);
  if (bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> *)
                        0x2b4cd8);
  }
  else {
    __x_00 = local_7c;
    loadGlyph((Font *)CONCAT44(uVar5,in_XMM0_Da),(Uint32)((ulong)__x >> 0x20),(uint)__x,
              SUB81(UVar2 >> 0x38,0),(float)UVar2);
    this_00 = &local_c8;
    std::make_pair<unsigned_long_long&,sf::Glyph&>
              (__x_00,(Glyph *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    _Var4 = std::
            map<unsigned_long_long,sf::Glyph,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
            ::insert<std::pair<unsigned_long_long,sf::Glyph>>
                      (this_00,(pair<unsigned_long_long,_sf::Glyph> *)__x);
    local_90 = (_Base_ptr)_Var4.first._M_node;
    local_88 = _Var4.second;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> *)
                        0x2b4d84);
  }
  local_8 = &ppVar3->second;
  return local_8;
}

Assistant:

const Glyph& Font::getGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // Get the page corresponding to the character size
    GlyphTable& glyphs = loadPage(characterSize).glyphs;

    // Build the key by combining the glyph index (based on code point), bold flag, and outline thickness
    Uint64 key = combine(outlineThickness, bold, FT_Get_Char_Index(static_cast<FT_Face>(m_face), codePoint));

    // Search the glyph into the cache
    GlyphTable::const_iterator it = glyphs.find(key);
    if (it != glyphs.end())
    {
        // Found: just return it
        return it->second;
    }
    else
    {
        // Not found: we have to load it
        Glyph glyph = loadGlyph(codePoint, characterSize, bold, outlineThickness);
        return glyphs.insert(std::make_pair(key, glyph)).first->second;
    }
}